

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O2

ogt_vox_transform *
ogt_vox_sample_group_transform_global
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_group *group,uint32_t frame_index,
          ogt_vox_scene *scene)

{
  ogt_vox_group *poVar1;
  uint uVar2;
  ogt_vox_transform group_transform;
  ogt_vox_transform local_b0;
  ogt_vox_transform local_70;
  
  ogt_vox_sample_group_transform_local(__return_storage_ptr__,group,frame_index);
  for (uVar2 = group->parent_group_index; uVar2 != 0xffffffff;
      uVar2 = poVar1[uVar2].parent_group_index) {
    poVar1 = scene->groups;
    ogt_vox_sample_group_transform_local(&local_70,poVar1 + uVar2,frame_index);
    ogt_vox_transform_multiply(&local_b0,__return_storage_ptr__,&local_70);
    __return_storage_ptr__->m30 = local_b0.m30;
    __return_storage_ptr__->m31 = local_b0.m31;
    __return_storage_ptr__->m32 = local_b0.m32;
    __return_storage_ptr__->m33 = local_b0.m33;
    __return_storage_ptr__->m20 = local_b0.m20;
    __return_storage_ptr__->m21 = local_b0.m21;
    __return_storage_ptr__->m22 = local_b0.m22;
    __return_storage_ptr__->m23 = local_b0.m23;
    __return_storage_ptr__->m10 = local_b0.m10;
    __return_storage_ptr__->m11 = local_b0.m11;
    __return_storage_ptr__->m12 = local_b0.m12;
    __return_storage_ptr__->m13 = local_b0.m13;
    __return_storage_ptr__->m00 = local_b0.m00;
    __return_storage_ptr__->m01 = local_b0.m01;
    __return_storage_ptr__->m02 = local_b0.m02;
    __return_storage_ptr__->m03 = local_b0.m03;
  }
  return __return_storage_ptr__;
}

Assistant:

ogt_vox_transform ogt_vox_sample_group_transform_global(const ogt_vox_group* group, uint32_t frame_index, const ogt_vox_scene* scene)
    {
        ogt_vox_transform flattened_transform = ogt_vox_sample_group_transform_local(group, frame_index);
        uint32_t group_index = group->parent_group_index;
        while (group_index != k_invalid_group_index) {
            group = &scene->groups[group_index];
            ogt_vox_transform group_transform = ogt_vox_sample_group_transform_local(group, frame_index);
            flattened_transform = ogt_vox_transform_multiply(flattened_transform, group_transform);
            group_index = group->parent_group_index;
        }
        return flattened_transform;
    }